

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O1

DdNode * Llb_ManConstructGroupBdd(Llb_Man_t *p,Llb_Grp_t *pGroup)

{
  int iVar1;
  void *pvVar2;
  DdNode *pDVar3;
  Vec_Ptr_t *pVVar4;
  DdNode *pDVar5;
  DdNode *f;
  long lVar6;
  long lVar7;
  
  pDVar3 = Cudd_ReadOne(p->dd);
  (p->pAig->pConst1->field_5).pData = pDVar3;
  pVVar4 = pGroup->vIns;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar7];
      iVar1 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar1 < 0) || (p->vObj2Var->nSize <= iVar1)) goto LAB_0081d272;
      pDVar3 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[iVar1]);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar3;
      lVar7 = lVar7 + 1;
      pVVar4 = pGroup->vIns;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = pGroup->vNodes;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar7];
      pDVar3 = Cudd_bddAnd(p->dd,(DdNode *)
                                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                                 *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                           0x28)),
                           (DdNode *)
                           ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                           *(ulong *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x28)
                           ));
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar3;
      if (pDVar3 == (DdNode *)0x0) {
        if (lVar7 == 0) {
          return (DdNode *)0x0;
        }
        lVar6 = 0;
        while (lVar6 < pGroup->vNodes->nSize) {
          pDVar3 = *(DdNode **)((long)pGroup->vNodes->pArray[lVar6] + 0x28);
          if (pDVar3 != (DdNode *)0x0) {
            Cudd_RecursiveDeref(p->dd,pDVar3);
          }
          lVar6 = lVar6 + 1;
          if (lVar7 == lVar6) {
            return (DdNode *)0x0;
          }
        }
        goto LAB_0081d291;
      }
      Cudd_Ref(pDVar3);
      lVar7 = lVar7 + 1;
      pVVar4 = pGroup->vNodes;
    } while (lVar7 < pVVar4->nSize);
  }
  pDVar3 = Cudd_ReadOne(p->dd);
  Cudd_Ref(pDVar3);
  pVVar4 = pGroup->vOuts;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    f = pDVar3;
    do {
      pvVar2 = pVVar4->pArray[lVar7];
      if ((*(uint *)((long)pvVar2 + 0x18) & 7) == 3) {
        pDVar3 = (DdNode *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                 *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28));
      }
      else {
        pDVar3 = *(DdNode **)((long)pvVar2 + 0x28);
      }
      iVar1 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar1 < 0) || (p->vObj2Var->nSize <= iVar1)) {
LAB_0081d272:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar5 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[iVar1]);
      pDVar5 = Cudd_bddXor(p->dd,pDVar3,pDVar5);
      Cudd_Ref(pDVar5);
      pDVar3 = Cudd_bddAnd(p->dd,f,(DdNode *)((ulong)pDVar5 ^ 1));
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->dd,f);
        Cudd_RecursiveDeref(p->dd,pDVar5);
        if (lVar7 == 0) {
          return (DdNode *)0x0;
        }
        lVar6 = 0;
        while (lVar6 < pGroup->vNodes->nSize) {
          pDVar3 = *(DdNode **)((long)pGroup->vNodes->pArray[lVar6] + 0x28);
          if (pDVar3 != (DdNode *)0x0) {
            Cudd_RecursiveDeref(p->dd,pDVar3);
          }
          lVar6 = lVar6 + 1;
          if (lVar7 == lVar6) {
            return (DdNode *)0x0;
          }
        }
LAB_0081d291:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(p->dd,f);
      Cudd_RecursiveDeref(p->dd,pDVar5);
      lVar7 = lVar7 + 1;
      pVVar4 = pGroup->vOuts;
      f = pDVar3;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = pGroup->vNodes;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      Cudd_RecursiveDeref(p->dd,*(DdNode **)((long)pVVar4->pArray[lVar7] + 0x28));
      lVar7 = lVar7 + 1;
      pVVar4 = pGroup->vNodes;
    } while (lVar7 < pVVar4->nSize);
  }
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * Llb_ManConstructGroupBdd( Llb_Man_t * p, Llb_Grp_t * pGroup )
{
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bRes, * bXor, * bTemp;
    int i, k;
    Aig_ManConst1(p->pAig)->pData = Cudd_ReadOne( p->dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        pObj->pData = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( p->dd, bBdd0, bBdd1, p->pPars->TimeTarget );  
        pObj->pData = Cudd_bddAnd( p->dd, bBdd0, bBdd1 );  
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, pGroup->vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( Aig_ObjIsCo(pObj) )
            bBdd0 = Cudd_NotCond( Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        else
            bBdd0 = (DdNode *)pObj->pData;
        bBdd1 = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bXor  = Cudd_bddXor( p->dd, bBdd0, bBdd1 );                  Cudd_Ref( bXor );
//        bRes  = Extra_bddAndTime( p->dd, bTemp = bRes, Cudd_Not(bXor), p->pPars->TimeTarget );  
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, Cudd_Not(bXor) );  
        if ( bRes == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bXor );
            Vec_PtrForEachEntryStop( Aig_Obj_t *, pGroup->vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bXor );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vNodes, pObj, i )
        Cudd_RecursiveDeref( p->dd, (DdNode *)pObj->pData );
    Cudd_Deref( bRes );
    return bRes;
}